

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Value __thiscall toml::internal::Parser::parse(Parser *this)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  anon_union_8_8_51f126cb_for_Value_2 extraout_RDX;
  Parser *in_RSI;
  Value *in_RDI;
  Value VVar4;
  Value *currentValue;
  Parser *in_stack_000000c0;
  Value root;
  Value *in_stack_00000160;
  Parser *in_stack_00000168;
  Parser *in_stack_fffffffffffffee0;
  allocator *paVar5;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  Value *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  TokenType in_stack_ffffffffffffff04;
  allocator local_b9;
  string local_b8 [32];
  undefined4 local_98;
  allocator local_91;
  string local_90 [32];
  Value *local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  Value *current;
  Parser *this_00;
  Value local_20 [2];
  
  this_00 = (Parser *)0x0;
  local_48 = 0;
  current = (Value *)0x0;
  local_58 = 0;
  uStack_50 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
         *)0x17e2de);
  Value::Value(in_stack_fffffffffffffef0,
               (Table *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          *)0x17e2ff);
  local_70 = local_20;
  do {
    while( true ) {
      skipForKey(in_stack_fffffffffffffee0);
      pTVar3 = token(in_RSI);
      TVar2 = Token::type(pTVar3);
      if (TVar2 == END_OF_FILE) {
        Value::Value(in_RDI,local_20);
        goto LAB_0017e5a0;
      }
      pTVar3 = token(in_RSI);
      in_stack_ffffffffffffff04 = Token::type(pTVar3);
      if (in_stack_ffffffffffffff04 != LBRACKET) break;
      local_70 = parseGroupKey(in_stack_00000168,in_stack_00000160);
      if (local_70 == (Value *)0x0) {
        paVar5 = &local_91;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,"error when parsing group key",paVar5);
        addError(in_stack_000000c0,(string *)currentValue);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        Value::Value(in_RDI);
LAB_0017e5a0:
        local_98 = 1;
        Value::~Value((Value *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        VVar4.field_1.null_ = extraout_RDX.null_;
        VVar4._0_8_ = in_RDI;
        return VVar4;
      }
    }
    bVar1 = parseKeyValue(this_00,current);
  } while (bVar1);
  paVar5 = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"error when parsing key Value",paVar5);
  addError(in_stack_000000c0,(string *)currentValue);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  Value::Value(in_RDI);
  goto LAB_0017e5a0;
}

Assistant:

inline Value Parser::parse()
{
    Value root((Table()));
    Value* currentValue = &root;

    while (true) {
        skipForKey();
        if (token().type() == TokenType::END_OF_FILE)
            break;
        if (token().type() == TokenType::LBRACKET) {
            currentValue = parseGroupKey(&root);
            if (!currentValue) {
                addError("error when parsing group key");
                return Value();
            }
            continue;
        }

        if (!parseKeyValue(currentValue)) {
            addError("error when parsing key Value");
            return Value();
        }
    }
    return root;
}